

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall cfd::core::BlindFactor::BlindFactor(BlindFactor *this,BlindFactor *object)

{
  BlindFactor *object_local;
  BlindFactor *this_local;
  
  this->_vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_003ebf68;
  ByteData256::ByteData256(&this->data_);
  ByteData256::operator=(&this->data_,&object->data_);
  return;
}

Assistant:

BlindFactor::BlindFactor(const BlindFactor &object) { data_ = object.data_; }